

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

_Bool oonf_layer2_net_cleanup(oonf_layer2_net *l2net,oonf_layer2_origin *origin,_Bool cleanup_neigh)

{
  char *pcVar1;
  _Bool _Var2;
  long lVar3;
  _Bool _Var4;
  list_entity *plVar5;
  
  _Var4 = false;
  for (lVar3 = 0x130; lVar3 != 0x3b0; lVar3 = lVar3 + 0x28) {
    if (*(oonf_layer2_origin **)(l2net->name + lVar3) == origin) {
      pcVar1 = l2net->name + lVar3 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      _Var4 = true;
    }
  }
  for (lVar3 = 0x3b0; lVar3 != 0x7c0; lVar3 = lVar3 + 0x28) {
    if (*(oonf_layer2_origin **)(l2net->name + lVar3) == origin) {
      pcVar1 = l2net->name + lVar3 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      _Var4 = true;
    }
  }
  if (cleanup_neigh) {
    plVar5 = &(l2net->neighbors).list_head;
    while (plVar5 = ((list_entity *)&plVar5->next)->next,
          plVar5->prev != (l2net->neighbors).list_head.prev) {
      _Var2 = oonf_layer2_neigh_cleanup((oonf_layer2_neigh *)(plVar5 + -0x4c),origin);
      _Var4 = (_Bool)(_Var4 | _Var2);
    }
  }
  return _Var4;
}

Assistant:

bool
oonf_layer2_net_cleanup(struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *origin, bool cleanup_neigh) {
  struct oonf_layer2_neigh *l2neigh;
  bool changed = false;
  int i;

  for (i = 0; i < OONF_LAYER2_NET_COUNT; i++) {
    if (l2net->data[i]._origin == origin) {
      oonf_layer2_data_reset(&l2net->data[i]);
      changed = true;
    }
  }
  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (l2net->neighdata[i]._origin == origin) {
      oonf_layer2_data_reset(&l2net->neighdata[i]);
      changed = true;
    }
  }

  if (cleanup_neigh) {
    avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
      changed |= oonf_layer2_neigh_cleanup(l2neigh, origin);
    }
  }
  return changed;
}